

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O3

void asm_snap_alloc1(ASMState *as,IRRef ref)

{
  uint8_t uVar1;
  IRIns *pIVar2;
  IRRef1 *pIVar3;
  byte bVar4;
  Reg RVar5;
  uint uVar6;
  IRIns *pIVar7;
  long lVar8;
  IRIns *pIVar9;
  IRRef ref_00;
  ulong uVar10;
  IRIns *ir;
  
  uVar10 = (ulong)ref;
  if (ref < 0x8000) {
    return;
  }
  pIVar7 = as->ir;
  ir = pIVar7 + ref;
  do {
    uVar1 = (ir->field_1).r;
    if (-1 < (char)uVar1) {
      return;
    }
    if (uVar1 == 0xfd) {
      return;
    }
    if ((ir->field_1).s != '\0') {
      return;
    }
    if (uVar1 == 0xfe) {
      (ir->field_1).r = 0xfd;
      if ((ir->field_1).o != 'Q') {
        pIVar7 = as->ir + (as->snapref - 1);
        break;
      }
      ir = (IRIns *)&(ir->field_0).op2;
      pIVar7 = as->ir;
    }
    else {
      ref_00 = (IRRef)uVar10;
      if (((ir->field_1).o != 'U') || ((ir->field_0).op2 != 0x1d3)) {
LAB_0013ec92:
        bVar4 = ((ir->field_1).t.irt & 0x1f) - 0xd;
        uVar6 = 0xffef;
        if (bVar4 < 2) {
          uVar6 = 0xffff0000;
        }
        if ((as->freeset & uVar6) != 0) goto LAB_0013ecb1;
        if (bVar4 < 2) {
          lVar8 = 0;
          do {
            if ((*(byte *)((long)as->cost + lVar8 * 4 + 0x41) & 0x80) == 0) {
LAB_0013ecb1:
              RVar5 = ra_allocref(as,ref_00,uVar6);
              if (((ir->field_1).t.irt & 0x40) == 0) {
                as->weakset = as->weakset | 1 << ((byte)RVar5 & 0x1f);
              }
              if (as->mclim <= as->mcp) {
                return;
              }
              asm_mclimit(as);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x10);
        }
        ra_spill(as,ir);
        return;
      }
      for (pIVar9 = pIVar7 + as->curins; ir < pIVar9; pIVar9 = pIVar9 + -1) {
        if (((ref_00 == (pIVar9->field_0).op1) || (ref_00 == (pIVar9->field_0).op2)) &&
           (1 < (byte)((pIVar9->field_1).r + 3))) goto LAB_0013ec92;
      }
    }
    pIVar3 = &(ir->field_0).op1;
    uVar10 = (ulong)*pIVar3;
    ir = pIVar7 + uVar10;
    if (-1 < (short)*pIVar3) {
      return;
    }
  } while( true );
LAB_0013ed24:
  if (pIVar7 <= ir) {
    return;
  }
  if ((pIVar7->field_1).r == 0xfe) {
    if ((ulong)(pIVar7->field_1).s == 0xff) {
      uVar6 = (pIVar7->field_1).o - 0x47;
      if ((uVar6 < 5) && (uVar6 != 2)) {
        pIVar2 = as->ir;
        pIVar9 = pIVar2 + (pIVar7->field_0).op1;
        if (((pIVar9->field_1).o & 0xfe) == 0x38) {
          pIVar9 = pIVar2 + (pIVar9->field_0).op1;
        }
        if (pIVar2 + (pIVar9->field_0).op1 == ir) goto LAB_0013ed87;
      }
    }
    else if (pIVar7 == ir + (pIVar7->field_1).s) {
LAB_0013ed87:
      asm_snap_alloc1(as,(uint)(pIVar7->field_0).op2);
    }
  }
  pIVar7 = pIVar7 + -1;
  goto LAB_0013ed24;
}

Assistant:

static void asm_snap_alloc1(ASMState *as, IRRef ref)
{
  IRIns *ir = IR(ref);
  if (!irref_isk(ref) && (!(ra_used(ir) || ir->r == RID_SUNK))) {
    if (ir->r == RID_SINK) {
      ir->r = RID_SUNK;
#if LJ_HASFFI
      if (ir->o == IR_CNEWI) {  /* Allocate CNEWI value. */
	asm_snap_alloc1(as, ir->op2);
	if (LJ_32 && (ir+1)->o == IR_HIOP)
	  asm_snap_alloc1(as, (ir+1)->op2);
      } else
#endif
      {  /* Allocate stored values for TNEW, TDUP and CNEW. */
	IRIns *irs;
	lua_assert(ir->o == IR_TNEW || ir->o == IR_TDUP || ir->o == IR_CNEW);
	for (irs = IR(as->snapref-1); irs > ir; irs--)
	  if (irs->r == RID_SINK && asm_sunk_store(as, ir, irs)) {
	    lua_assert(irs->o == IR_ASTORE || irs->o == IR_HSTORE ||
		       irs->o == IR_FSTORE || irs->o == IR_XSTORE);
	    asm_snap_alloc1(as, irs->op2);
	    if (LJ_32 && (irs+1)->o == IR_HIOP)
	      asm_snap_alloc1(as, (irs+1)->op2);
	  }
      }
    } else {
      RegSet allow;
      if (ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT) {
	IRIns *irc;
	for (irc = IR(as->curins); irc > ir; irc--)
	  if ((irc->op1 == ref || irc->op2 == ref) &&
	      !(irc->r == RID_SINK || irc->r == RID_SUNK))
	    goto nosink;  /* Don't sink conversion if result is used. */
	asm_snap_alloc1(as, ir->op1);
	return;
      }
    nosink:
      allow = (!LJ_SOFTFP && irt_isfp(ir->t)) ? RSET_FPR : RSET_GPR;
      if ((as->freeset & allow) ||
	       (allow == RSET_FPR && asm_snap_canremat(as))) {
	/* Get a weak register if we have a free one or can rematerialize. */
	Reg r = ra_allocref(as, ref, allow);  /* Allocate a register. */
	if (!irt_isphi(ir->t))
	  ra_weak(as, r);  /* But mark it as weakly referenced. */
	checkmclim(as);
	RA_DBGX((as, "snapreg   $f $r", ref, ir->r));
      } else {
	ra_spill(as, ir);  /* Otherwise force a spill slot. */
	RA_DBGX((as, "snapspill $f $s", ref, ir->s));
      }
    }
  }
}